

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  code *pcVar1;
  rplidar_response_measurement_node_hq_t *nodes_00;
  int angle_max_00;
  int angle_min_00;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  size_t node_count;
  undefined1 *puVar6;
  undefined1 local_6698 [16];
  rplidar_response_measurement_node_hq_t *local_6688;
  ostream *local_6680;
  int local_6674;
  ostream *local_6670;
  ostream *local_6668;
  int local_665c;
  ostream *local_6658;
  RPlidarDriver *local_6650;
  ostream *local_6648;
  ostream *local_6640;
  uint local_6638;
  uint local_6634;
  RPlidarDriver *local_6630;
  undefined4 local_6628;
  undefined4 local_6624;
  float angle_max_1;
  float angle_min_1;
  int i_1;
  int end_node;
  int start_node;
  int angle_compensate_nodes_index;
  int j;
  float angle_value;
  float angle;
  int i;
  unsigned_long __vla_expr0;
  int local_65f0;
  int local_65ec;
  int angle_compensate_offset;
  int angle_compensate_nodes_count;
  float angle_max;
  float angle_min;
  size_t count;
  rplidar_response_measurement_node_hq_t nodes [2880];
  uint32_t local_bd0;
  undefined1 local_bcc [4];
  uint32_t scan_num;
  rplidar_response_device_info_t devinfo;
  RPlidarDriver *local_ba8;
  RPlidarDriver *drv;
  bool inverted;
  int angle_compensate_multiple;
  bool angle_compensate;
  u_result op_result;
  _u32 opt_com_baudrate;
  char *opt_com_path;
  long delta_time;
  long current_time;
  long previous_time;
  LaserScan scan;
  
  puVar6 = local_6698;
  scan.intensities[0x166] = 0.0;
  poVar3 = std::operator<<((ostream *)&std::cout,"progress begins ...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  slam::sensor::LidarScan<360>::LidarScan((LidarScan<360> *)&previous_time);
  current_time = 0;
  local_ba8 = (RPlidarDriver *)rp::standalone::rplidar::RPlidarDriver::CreateDriver(0);
  local_6630 = local_ba8;
  if (local_ba8 == (RPlidarDriver *)0x0) {
    fprintf(_stderr,"insufficent memory, exit\n");
  }
  else {
    local_6634 = (*(code *)**(undefined8 **)local_ba8)(local_ba8,"/dev/ttyUSB1",0x1c200,0);
    if ((local_6634 & 0x80000000) == 0) {
      local_6638 = (**(code **)(*(long *)local_ba8 + 0x50))(local_ba8,local_bcc,2000);
      if ((local_6638 & 0x80000000) == 0) {
        local_6640 = std::operator<<((ostream *)&std::cout,"connected successfully ...");
        std::ostream::operator<<(local_6640,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_6648 = std::operator<<((ostream *)&std::cout,"get device information failed");
        std::ostream::operator<<(local_6648,std::endl<char,std::char_traits<char>>);
        local_6650 = local_ba8;
        if (local_ba8 != (RPlidarDriver *)0x0) {
          (**(code **)(*(long *)local_ba8 + 0xe0))();
        }
        local_ba8 = (RPlidarDriver *)0x0;
      }
    }
    else {
      local_6658 = std::operator<<((ostream *)&std::cout,"connected failed ...");
      std::ostream::operator<<(local_6658,std::endl<char,std::char_traits<char>>);
    }
    (**(code **)(*(long *)local_ba8 + 0x68))();
    (**(code **)(*(long *)local_ba8 + 0x38))(local_ba8,0,1,0,0);
    local_bd0 = 0;
    puVar6 = local_6698;
LAB_00104ed6:
    do {
      _angle_max = 0xb40;
      pcVar1 = *(code **)(*(long *)local_ba8 + 0xb0);
      *(undefined8 *)(puVar6 + -8) = 0x104f09;
      local_665c = (*pcVar1)(local_ba8,&count,&angle_max,2000);
      if (local_665c == 0) {
        local_bd0 = local_bd0 + 1;
        if (local_bd0 == 1) {
          *(undefined8 *)(puVar6 + -8) = 0x104f47;
          current_time = getCurrentTime_ms();
          goto LAB_00104ed6;
        }
        *(undefined8 *)(puVar6 + -8) = 0x104f5f;
        lVar4 = getCurrentTime_ms();
        *(undefined8 *)(puVar6 + -8) = 0x104f91;
        poVar3 = std::operator<<((ostream *)&std::cout,"delta_time = ");
        local_6668 = poVar3;
        *(undefined8 *)(puVar6 + -8) = 0x104fad;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar4 - current_time);
        local_6670 = poVar3;
        *(undefined8 *)(puVar6 + -8) = 0x104fc9;
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        uVar2 = _angle_max;
        pcVar1 = *(code **)(*(long *)local_ba8 + 0xc0);
        *(undefined8 *)(puVar6 + -8) = 0x104fec;
        local_6674 = (*pcVar1)(local_ba8,&count,uVar2);
        angle_compensate_nodes_count = 0;
        angle_compensate_offset = 0x40c880e0;
        if (local_6674 == 0) {
          delta_time._0_4_ = (uint32_t)lVar4;
          *(undefined8 *)(puVar6 + -8) = 0x105048;
          poVar3 = std::operator<<((ostream *)&std::cout,"in here ...");
          local_6680 = poVar3;
          *(undefined8 *)(puVar6 + -8) = 0x105064;
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          local_65ec = 0x168;
          local_65f0 = 0;
          _angle = 0x168;
          local_6688 = (rplidar_response_measurement_node_hq_t *)(puVar6 + -0xb40);
          __vla_expr0 = (unsigned_long)puVar6;
          *(undefined8 *)(puVar6 + -0xb48) = 0x1050c7;
          memset((rplidar_response_measurement_node_hq_t *)(puVar6 + -0xb40),0,0xb40);
          for (angle_value = 0.0; angle_min_00 = angle_compensate_nodes_count,
              angle_max_00 = angle_compensate_offset, nodes_00 = local_6688,
              (ulong)(long)(int)angle_value < _angle_max;
              angle_value = (float)((int)angle_value + 1)) {
            if (nodes[(long)(int)angle_value + -1].dist_mm_q2 != 0) {
              lVar5 = (long)(int)angle_value;
              *(undefined8 *)(puVar6 + -0xb48) = 0x105114;
              j = (int)getAngle(nodes + lVar5 + -1);
              angle_compensate_nodes_index = (int)(float)(int)((float)j * 1.0);
              if ((float)angle_compensate_nodes_index - (float)local_65f0 < 0.0) {
                local_65f0 = (int)(float)angle_compensate_nodes_index;
              }
              for (start_node = 0; start_node < 1; start_node = start_node + 1) {
                end_node = (int)(((float)angle_compensate_nodes_index - (float)local_65f0) +
                                (float)start_node);
                if (local_65ec <= end_node) {
                  end_node = local_65ec + -1;
                }
                local_6688[end_node] = nodes[(long)(int)angle_value + -1];
              }
            }
          }
          node_count = (size_t)local_65ec;
          *(undefined8 *)(puVar6 + -0xb48) = 0x105276;
          publish_scan(nodes_00,(LaserScan *)&previous_time,node_count,(uint32_t)delta_time,
                       (double)(lVar4 - current_time) * 0.001,false,(float)angle_min_00,
                       (float)angle_max_00,8.0,local_bd0);
          puVar6 = (undefined1 *)__vla_expr0;
          current_time = lVar4;
        }
        else {
          current_time = lVar4;
          if (local_6674 == -0x7fff7fff) {
            local_6624 = 0;
            local_6628 = 0x40c880e0;
          }
        }
      }
    } while ((ctrl_c_pressed & 1U) == 0);
    pcVar1 = *(code **)(*(long *)local_ba8 + 0xa0);
    *(undefined8 *)(puVar6 + -8) = 0x10545e;
    (*pcVar1)(local_ba8,2000);
    pcVar1 = *(code **)(*(long *)local_ba8 + 0x70);
    *(undefined8 *)(puVar6 + -8) = 0x105470;
    (*pcVar1)();
    *(undefined8 *)(puVar6 + -8) = 0x10547e;
    rp::standalone::rplidar::RPlidarDriver::DisposeDriver(local_ba8);
  }
  scan.intensities[0x166] = 0.0;
  devinfo.serialnum[8] = '\x01';
  devinfo.serialnum[9] = '\0';
  devinfo.serialnum[10] = '\0';
  devinfo.serialnum[0xb] = '\0';
  *(undefined8 *)(puVar6 + -8) = 0x1054a8;
  slam::sensor::LidarScan<360>::~LidarScan((LidarScan<360> *)&previous_time);
  return (int)scan.intensities[0x166];
}

Assistant:

int main()
{
	std::cout<<"progress begins ..."<<std::endl;

	slam::sensor::LaserScan scan;

	long previous_time = 0;
	long current_time = 0;
	long delta_time = 0;

	const char * opt_com_path = "/dev/ttyUSB1";
	_u32 opt_com_baudrate = 115200;
	u_result op_result;
	
	bool angle_compensate = true;
	int angle_compensate_multiple = 1;
	bool inverted = false;	

	// create the driver instance
        RPlidarDriver * drv = RPlidarDriver::CreateDriver(DRIVER_TYPE_SERIALPORT);

	if (!drv) {
        	fprintf(stderr, "insufficent memory, exit\n");
        	return false;
    	}
	
	rplidar_response_device_info_t devinfo;
	if (IS_OK(drv->connect(opt_com_path, opt_com_baudrate)))
        {
            op_result = drv->getDeviceInfo(devinfo);

            if (IS_OK(op_result))
            {   
              	std::cout<<"connected successfully ..."<<std::endl;
            }
            else
            {
		std::cout<<"get device information failed"<<std::endl;
                delete drv;
                drv = NULL;
            }
        }
	else{
		std::cout<<"connected failed ..."<<std::endl;
	}

	drv->startMotor();
	drv->startScan( 0, 1 );
	
	uint32_t scan_num  = 0;
	while(1){
		rplidar_response_measurement_node_hq_t nodes[360 * 8];
		size_t   count = _countof(nodes);
		op_result = drv->grabScanDataHq( nodes, count );
		
		if( op_result == RESULT_OK ){
			scan_num ++;
			if( scan_num == 1 ){
				current_time = previous_time = getCurrentTime_ms();
				continue;
			}
			current_time = getCurrentTime_ms();
			delta_time = current_time - previous_time;
			std::cout<<"delta_time = "<<delta_time<<std::endl;
			op_result = drv->ascendScanData( nodes, count );
			float angle_min = DEG2RAD( 0.0f );
			float angle_max = DEG2RAD( 359.0f );
			if( op_result == RESULT_OK ){
				if( angle_compensate ){
					std::cout<<"in here ..."<<std::endl;
					const int angle_compensate_nodes_count = 360 * angle_compensate_multiple;
					int angle_compensate_offset = 0;
					rplidar_response_measurement_node_hq_t angle_compensate_nodes[ angle_compensate_nodes_count ];
					memset( angle_compensate_nodes, 0, angle_compensate_nodes_count * sizeof( rplidar_response_measurement_node_hq_t ) );
					
					for( int i = 0; i < count; i ++ ){
						if( nodes[i].dist_mm_q2 != 0 ){
							float angle = getAngle( nodes[i] );
							float angle_value = (int)( angle * angle_compensate_multiple );
							if( ( angle_value - angle_compensate_offset ) < 0 ) angle_compensate_offset = angle_value;
							for( int j = 0; j < angle_compensate_multiple; j ++ ){
								int angle_compensate_nodes_index = angle_value - angle_compensate_offset + j ;
								if( angle_compensate_nodes_index >= angle_compensate_nodes_count )
									angle_compensate_nodes_index = angle_compensate_nodes_count - 1 ;
								angle_compensate_nodes[angle_compensate_nodes_index] = nodes[i];
							}
						}
					}
					
					publish_scan( angle_compensate_nodes, scan, angle_compensate_nodes_count, \
						        current_time, ( double )( delta_time * 0.001 ), inverted, angle_min, angle_max, 8.0, scan_num );
				}
				else{
					int start_node = 0, end_node = 0;
					int i = 0;	
					while( nodes[i++].dist_mm_q2 == 0 );
					start_node = i - 1;
					i = count - 1;
					while( nodes[i--].dist_mm_q2 == 0 );
					end_node = i + 1;

					angle_min = DEG2RAD( getAngle( nodes[start_node] ) );
					angle_max = DEG2RAD( getAngle( nodes[end_node] ) );

					publish_scan( nodes, scan, count, current_time, ( double )( delta_time * 0.001 ), inverted, angle_min, angle_max, 8.0, scan_num );
				}
			}
			else if( op_result == RESULT_OPERATION_FAIL ){
				float angle_min = DEG2RAD( 0.0f );
				float angle_max = DEG2RAD( 359.0f );
				//publish_scan(  );
			}

			previous_time = current_time;
		}
		
		if( ctrl_c_pressed ){
			break;
		}
        }
	
	drv->stop();
	drv->stopMotor();
	RPlidarDriver::DisposeDriver(drv);
    	drv = NULL;

	
	return 0;
}